

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::setDown(QAbstractButton *this,bool down)

{
  byte bVar1;
  QAbstractButtonPrivate *obj;
  byte in_SIL;
  QAbstractButtonPrivate *in_RDI;
  int in_stack_0000000c;
  QAbstractButtonPrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  obj = d_func((QAbstractButton *)0x500025);
  if (((byte)obj->field_0x28c >> 4 & 1) != (bVar1 & 1)) {
    obj->field_0x28c = obj->field_0x28c & 0xef | (bVar1 & 1) << 4;
    QAbstractButtonPrivate::refresh(in_RDI);
    if ((((byte)obj->field_0x28c >> 2 & 1) == 0) || (((byte)obj->field_0x28c >> 4 & 1) == 0)) {
      QBasicTimer::stop();
    }
    else {
      QBasicTimer::start((QBasicTimer *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_0000000c,
                         (QObject *)obj);
    }
  }
  return;
}

Assistant:

void QAbstractButton::setDown(bool down)
{
    Q_D(QAbstractButton);
    if (d->down == down)
        return;
    d->down = down;
    d->refresh();
    if (d->autoRepeat && d->down)
        d->repeatTimer.start(d->autoRepeatDelay, this);
    else
        d->repeatTimer.stop();
}